

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall SQCompilation::CodegenVisitor::visitArrayExpr(CodegenVisitor *this,ArrayExpr *expr)

{
  SQFuncState *this_00;
  Node *n;
  SQInteger SVar1;
  SQInteger arg0;
  long line;
  SQUnsignedInteger i;
  ulong uVar2;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  this_00 = this->_fs;
  SVar1 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction(this_00,_OP_NEWOBJ,SVar1,(ulong)(expr->_inits)._size,0,1);
  for (uVar2 = 0; uVar2 < (expr->_inits)._size; uVar2 = uVar2 + 1) {
    n = &(expr->_inits)._vals[uVar2]->super_Node;
    if ((uVar2 < 100) && (line = (long)(n->_coordinates).lineStart, line != -1)) {
      SQFuncState::AddLineInfos(this->_fs,line,false,false);
    }
    visitForceGet(this,n);
    SVar1 = SQFuncState::PopTarget(this->_fs);
    arg0 = SQFuncState::TopTarget(this->_fs);
    SQFuncState::AddInstruction(this->_fs,_OP_APPENDARRAY,arg0,SVar1,0,0);
  }
  return;
}

Assistant:

void CodegenVisitor::visitArrayExpr(ArrayExpr *expr) {
    maybeAddInExprLine(expr);
    const auto &inits = expr->initializers();

    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), inits.size(), 0, NOT_ARRAY);

    for (SQUnsignedInteger i = 0; i < inits.size(); ++i) {
        Expr *valExpr = inits[i];
#if SQ_LINE_INFO_IN_STRUCTURES
        if (i < 100 && valExpr->lineStart() != -1)
            _fs->AddLineInfos(valExpr->lineStart(), false, false);
#endif
        visitForceGet(valExpr);
        SQInteger val = _fs->PopTarget();
        SQInteger array = _fs->TopTarget();
        _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
    }
}